

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool enchant_score(int16_t *score,_Bool is_artifact)

{
  uint32_t uVar1;
  int local_20;
  wchar_t chance;
  _Bool is_artifact_local;
  int16_t *score_local;
  
  if ((is_artifact) && (uVar1 = Rand_div(100), (int)uVar1 < 0x32)) {
    score_local._7_1_ = false;
  }
  else {
    if (*score < 0) {
      local_20 = 0;
    }
    else if (*score < 0x10) {
      local_20 = enchant_table[*score];
    }
    else {
      local_20 = 1000;
    }
    uVar1 = Rand_div(1000);
    if (local_20 < (int)(uVar1 + 1)) {
      *score = *score + 1;
      score_local._7_1_ = true;
    }
    else {
      score_local._7_1_ = false;
    }
  }
  return score_local._7_1_;
}

Assistant:

static bool enchant_score(int16_t *score, bool is_artifact)
{
	int chance;

	/* Artifacts resist enchantment half the time */
	if (is_artifact && randint0(100) < 50) return false;

	/* Figure out the chance to enchant */
	if (*score < 0) chance = 0;
	else if (*score > 15) chance = 1000;
	else chance = enchant_table[*score];

	/* If we roll less-than-or-equal to chance, it fails */
	if (randint1(1000) <= chance) return false;

	/* Increment the score */
	++*score;

	return true;
}